

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O0

Type * anon_unknown.dwarf_bff3::load_alias(TypeNode *node,Factory *factory)

{
  Type *pTVar1;
  string local_60 [32];
  Type *local_40;
  Type *type;
  string source;
  Factory *factory_local;
  TypeNode *node_local;
  
  (anonymous_namespace)::getAttribute<std::__cxx11::string>
            ((_anonymous_namespace_ *)&type,node->xml,"source");
  std::__cxx11::string::string(local_60,(string *)&type);
  pTVar1 = Factory::build(factory,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  local_40 = pTVar1;
  Factory::alias(factory,node,(string *)&type);
  pTVar1 = local_40;
  std::__cxx11::string::~string((string *)&type);
  return pTVar1;
}

Assistant:

Type const* load_alias(TypeNode const& node, Factory& factory)
    {
        string source = getAttribute<string>(node.xml, "source");
        Type const* type = factory.build(source);
        factory.alias(node, source);
        return type;
    }